

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O2

int tcmalloc_backtrace_uncompress_zdebug
              (backtrace_state *state,uchar *compressed,size_t compressed_size,
              backtrace_error_callback error_callback,void *data,uchar **uncompressed,
              size_t *uncompressed_size)

{
  int iVar1;
  uint16_t *zdebug_table;
  
  zdebug_table = (uint16_t *)tcmalloc_backtrace_alloc(state,0x4000,error_callback,data);
  if (zdebug_table == (uint16_t *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = elf_uncompress_zdebug
                      (state,compressed,compressed_size,zdebug_table,error_callback,data,
                       uncompressed,uncompressed_size);
    tcmalloc_backtrace_free(state,zdebug_table,0x4000,error_callback,data);
  }
  return iVar1;
}

Assistant:

int
backtrace_uncompress_zdebug (struct backtrace_state *state,
			     const unsigned char *compressed,
			     size_t compressed_size,
			     backtrace_error_callback error_callback,
			     void *data, unsigned char **uncompressed,
			     size_t *uncompressed_size)
{
  uint16_t *zdebug_table;
  int ret;

  zdebug_table = ((uint16_t *) backtrace_alloc (state, ZDEBUG_TABLE_SIZE,
						error_callback, data));
  if (zdebug_table == NULL)
    return 0;
  ret = elf_uncompress_zdebug (state, compressed, compressed_size,
			       zdebug_table, error_callback, data,
			       uncompressed, uncompressed_size);
  backtrace_free (state, zdebug_table, ZDEBUG_TABLE_SIZE,
		  error_callback, data);
  return ret;
}